

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

void roaring64_bitmap_to_uint64_array(roaring64_bitmap_t *r,uint64_t *out)

{
  ulong uVar1;
  bool bVar2;
  uint16_t low16;
  uint16_t local_da;
  roaring64_iterator_t local_d8;
  
  local_d8.r = r;
  art_init_iterator(&local_d8.art_it,&r->art,true);
  bVar2 = local_d8.art_it.value == (ulong *)0x0;
  local_d8.has_value = !bVar2;
  if (bVar2) {
    local_d8.saturated_forward = true;
  }
  else {
    uVar1 = (ulong)CONCAT24(local_d8.art_it.key._4_2_,local_d8.art_it.key._0_4_);
    uVar1 = ((ulong)(ushort)local_d8.art_it.key._4_2_ << 0x20 & 0xff0000000000) >> 0x18 |
            ((ulong)(ushort)local_d8.art_it.key._4_2_ << 0x20 & 0xff00000000) >> 8 |
            (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
            uVar1 << 0x38;
    local_da = 0;
    local_d8.high48 = uVar1;
    local_d8.container_it =
         container_init_iterator
                   (r->containers[*local_d8.art_it.value >> 8],(uint8_t)*local_d8.art_it.value,
                    &local_da);
    local_d8.value = local_da | uVar1;
  }
  local_d8.has_value = !bVar2;
  roaring64_iterator_read(&local_d8,out,0xffffffffffffffff);
  return;
}

Assistant:

void roaring64_bitmap_to_uint64_array(const roaring64_bitmap_t *r,
                                      uint64_t *out) {
    roaring64_iterator_t it;  // gets initialized in the next line
    roaring64_iterator_init_at(r, &it, /*first=*/true);
    roaring64_iterator_read(&it, out, UINT64_MAX);
}